

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Spl_ManFindGoodCand(Spl_Man_t *p)

{
  int iVar1;
  int iObj;
  int iVar2;
  int iVar3;
  int iVar4;
  
  for (iVar3 = 0; iVar3 < p->vInputs->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(p->vInputs,iVar3);
    Vec_BitWriteEntry(p->vMarksIn,iVar1,1);
  }
  iVar3 = -1;
  iVar1 = 0;
  for (iVar4 = 0; iVar4 < p->vCands->nSize; iVar4 = iVar4 + 1) {
    iObj = Vec_IntEntry(p->vCands,iVar4);
    iVar2 = Spl_ManCountMarkedFanins(p->pGia,iObj,p->vMarksIn);
    if (iVar3 < iVar2) {
      iVar1 = iObj;
    }
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
  }
  for (iVar3 = 0; iVar3 < p->vInputs->nSize; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(p->vInputs,iVar3);
    Vec_BitWriteEntry(p->vMarksIn,iVar4,0);
  }
  return iVar1;
}

Assistant:

int Spl_ManFindGoodCand( Spl_Man_t * p )
{
    int i, iObj;
    int Res = 0, InCount, InCountMax = -1; 
    // mark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 1 );
    // find candidate with maximum input overlap
    Vec_IntForEachEntry( p->vCands, iObj, i )
    {
        InCount = Spl_ManCountMarkedFanins( p->pGia, iObj, p->vMarksIn );
        if ( InCountMax < InCount )
        {
            InCountMax = InCount;
            Res = iObj;
        }
    }
    // unmark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 0 );
    return Res;
}